

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  Extension *pEVar1;
  int in_EDX;
  Extension *extension;
  int in_stack_ffffffffffffff44;
  ExtensionSet *in_stack_ffffffffffffff48;
  int local_4;
  
  pEVar1 = FindOrNull(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  local_4 = in_EDX;
  if ((pEVar1 != (Extension *)0x0) && ((pEVar1->field_0xa & 1) == 0)) {
    local_4 = (pEVar1->field_0).enum_value;
  }
  return local_4;
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}